

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook>_> * __thiscall
kj::Vector<kj::Maybe<kj::Own<capnp::ClientHook>>>::add<kj::Own<capnp::ClientHook>>
          (Vector<kj::Maybe<kj::Own<capnp::ClientHook>>> *this,Own<capnp::ClientHook> *params)

{
  bool bVar1;
  Own<capnp::ClientHook> *params_00;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar2;
  Own<capnp::ClientHook> *params_local;
  Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *this_local;
  
  bVar1 = ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::isFull
                    ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)this);
  if (bVar1) {
    Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_>::grow
              ((Vector<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)this,0);
  }
  params_00 = fwd<kj::Own<capnp::ClientHook>>(params);
  pMVar2 = ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>>::add<kj::Own<capnp::ClientHook>>
                     ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook>>> *)this,params_00);
  return pMVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }